

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

Shell * __thiscall Shell::GetCommand_abi_cxx11_(Shell *this)

{
  Shell *this_local;
  string *s;
  
  std::__cxx11::string::string((string *)this);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)this);
  return this;
}

Assistant:

string Shell::GetCommand(){
	string s;
	getline(cin, s);
	return s;
}